

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O1

CSAT_StatusT ABC_Solve(ABC_Manager mng)

{
  Abc_Ntk_t **ppNtk;
  size_t __size;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  CSAT_StatusT CVar4;
  CSAT_Target_ResultT *pCVar5;
  char **__s;
  int *__s_00;
  char *pcVar6;
  size_t __size_00;
  long lVar7;
  
  if (mng->pTarget == (Abc_Ntk_t *)0x0) {
    puts("ABC_Solve: Target network is not derived by ABC_SolveInit().");
    CVar4 = UNDETERMINED;
  }
  else {
    ppNtk = &mng->pTarget;
    if (mng->mode == 0) {
      iVar3 = Abc_NtkIvyProve(ppNtk,&mng->Params);
    }
    else {
      iVar3 = Abc_NtkMiterSat(mng->pTarget,(long)(mng->Params).nMiteringLimitLast,0,0,
                              (ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
    }
    iVar1 = mng->pTarget->vCis->nSize;
    pCVar5 = (CSAT_Target_ResultT *)malloc(0x38);
    *(undefined8 *)&pCVar5->no_sig = 0;
    pCVar5->names = (char **)0x0;
    pCVar5->status = UNDETERMINED;
    pCVar5->num_dec = 0;
    pCVar5->num_imp = 0;
    pCVar5->num_cftg = 0;
    *(undefined8 *)&pCVar5->num_cfts = 0;
    pCVar5->time = 0.0;
    pCVar5->values = (int *)0x0;
    pCVar5->no_sig = iVar1;
    __size = (long)iVar1 * 8;
    __s = (char **)malloc(__size);
    pCVar5->names = __s;
    __size_00 = (long)iVar1 << 2;
    __s_00 = (int *)malloc(__size_00);
    pCVar5->values = __s_00;
    memset(__s,0,__size);
    memset(__s_00,0,__size_00);
    mng->pResult = pCVar5;
    if (iVar3 == 1) {
      pCVar5->status = UNSATISFIABLE;
    }
    else if (iVar3 == 0) {
      pCVar5->status = SATISFIABLE;
      if (0 < mng->pResult->no_sig) {
        lVar7 = 0;
        do {
          pVVar2 = mng->pNtk->vCis;
          if (pVVar2->nSize <= lVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar6 = ABC_GetNodeName(mng,(Abc_Obj_t *)pVVar2->pArray[lVar7]);
          pcVar6 = Extra_UtilStrsav(pcVar6);
          mng->pResult->names[lVar7] = pcVar6;
          pCVar5 = mng->pResult;
          pCVar5->values[lVar7] = mng->pTarget->pModel[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 < pCVar5->no_sig);
      }
      if ((*ppNtk)->pModel != (int *)0x0) {
        free((*ppNtk)->pModel);
        (*ppNtk)->pModel = (int *)0x0;
      }
    }
    else {
      if (iVar3 != -1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/csat/csat_apis.c"
                      ,0x284,"enum CSAT_StatusT ABC_Solve(ABC_Manager)");
      }
      pCVar5->status = UNDETERMINED;
    }
    Abc_NtkDelete(mng->pTarget);
    mng->pTarget = (Abc_Ntk_t *)0x0;
    CVar4 = mng->pResult->status;
  }
  return CVar4;
}

Assistant:

enum CSAT_StatusT ABC_Solve( ABC_Manager mng )
{
    Prove_Params_t * pParams = &mng->Params;
    int RetValue, i;

    // check if the target network is available
    if ( mng->pTarget == NULL )
        { printf( "ABC_Solve: Target network is not derived by ABC_SolveInit().\n" ); return UNDETERMINED; }

    // try to prove the miter using a number of techniques
    if ( mng->mode )
        RetValue = Abc_NtkMiterSat( mng->pTarget, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)0, 0, NULL, NULL );
    else
//        RetValue = Abc_NtkMiterProve( &mng->pTarget, pParams ); // old CEC engine
        RetValue = Abc_NtkIvyProve( &mng->pTarget, pParams ); // new CEC engine

    // analyze the result
    mng->pResult = ABC_TargetResAlloc( Abc_NtkCiNum(mng->pTarget) );
    if ( RetValue == -1 )
        mng->pResult->status = UNDETERMINED;
    else if ( RetValue == 1 )
        mng->pResult->status = UNSATISFIABLE;
    else if ( RetValue == 0 )
    {
        mng->pResult->status = SATISFIABLE;
        // create the array of PI names and values
        for ( i = 0; i < mng->pResult->no_sig; i++ )
        {
            mng->pResult->names[i]  = Extra_UtilStrsav( ABC_GetNodeName(mng, Abc_NtkCi(mng->pNtk, i)) ); 
            mng->pResult->values[i] = mng->pTarget->pModel[i];
        }
        ABC_FREE( mng->pTarget->pModel );
    }
    else assert( 0 );

    // delete the target
    Abc_NtkDelete( mng->pTarget );
    mng->pTarget = NULL;
    // return the status
    return mng->pResult->status;
}